

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

BBox3fa * __thiscall embree::SceneGraph::Node::bounds(Node *this,size_t i)

{
  BBox3fa *in_RDI;
  
  *(undefined8 *)&(in_RDI->lower).field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(in_RDI->lower).field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)&(in_RDI->upper).field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(in_RDI->upper).field_0 + 8) = 0xff800000ff800000;
  return in_RDI;
}

Assistant:

virtual BBox3fa bounds(size_t i) const {
        return empty;
      }